

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(DeepScanLineOutputFile *this)

{
  pthread_mutex_t *__mutex;
  OStream *pOVar1;
  OutputStreamMutex *pOVar2;
  Data *this_00;
  int iVar3;
  undefined4 extraout_var;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_003d7438;
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    iVar3 = (*this->_data->_streamData->os->_vptr_OStream[3])();
    if (this->_data->lineOffsetsPosition != 0) {
      (*this->_data->_streamData->os->_vptr_OStream[4])();
      anon_unknown_7::writeLineOffsets(this->_data->_streamData->os,&this->_data->lineOffsets);
      pOVar1 = this->_data->_streamData->os;
      (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar3));
    }
    pthread_mutex_unlock(__mutex);
    if ((this->_data->_deleteStream == true) &&
       (pOVar1 = this->_data->_streamData->os, pOVar1 != (OStream *)0x0)) {
      (*pOVar1->_vptr_OStream[1])();
    }
    if ((this->_data->partNumber == -1) &&
       (pOVar2 = this->_data->_streamData, pOVar2 != (OutputStreamMutex *)0x0)) {
      operator_delete(pOVar2,0x38);
    }
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) {
      Data::~Data(this_00);
      operator_delete(this_00,0x180);
    }
    GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

DeepScanLineOutputFile::~DeepScanLineOutputFile ()
{
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        uint64_t originalPosition = _data->_streamData->os->tellp ();

        if (_data->lineOffsetsPosition > 0)
        {
            try
            {
                _data->_streamData->os->seekp (_data->lineOffsetsPosition);
                writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);

                //
                // Restore the original position.
                //
                _data->_streamData->os->seekp (originalPosition);
            }
            catch (
                ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
            {
                //
                // We cannot safely throw any exceptions from here.
                // This destructor may have been called because the
                // stack is currently being unwound for another
                // exception.
                //
            }
        }
    }

    if (_data->_deleteStream) delete _data->_streamData->os;

    //
    // (TODO) we should have a way to tell if the stream data is owned by this file or
    // by a parent multipart file.
    //

    if (_data->partNumber == -1) delete _data->_streamData;

    delete _data;
}